

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O0

void __thiscall
mp::SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_>::ReadNL
          (SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_> *this,
          int nl_reader_flags)

{
  StringRef filename;
  int iVar1;
  function<void_()> *after_h;
  MultiObjTestSolver<2> *s;
  CStringRef in_RDI;
  double read_time;
  time_point start;
  MultiObjTestSolver<2> *in_stack_ffffffffffffff48;
  MultiObjMockProblemBuilder *in_stack_ffffffffffffff50;
  BasicStringRef<char> *this_00;
  Handler *h;
  long *this_01;
  BasicSolver *this_02;
  BasicCStringRef<char> local_70;
  double local_68;
  undefined1 local_49;
  long local_18;
  
  local_18 = std::chrono::_V2::steady_clock::now();
  this_02 = (BasicSolver *)
            (((SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
               *)((long)in_RDI.data_ + 0x3b8))->options_ + 2);
  operator_new(0x1c48);
  MultiObjMockProblemBuilder::MultiObjMockProblemBuilder<MultiObjTestSolver<2>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::unique_ptr<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>::
  reset((unique_ptr<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_> *)
        in_stack_ffffffffffffff50,(pointer)in_stack_ffffffffffffff48);
  this_01 = ((SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
              *)((long)in_RDI.data_ + 0x3b8))->options_ + 3;
  after_h = (function<void_()> *)operator_new(0x88);
  local_49 = 1;
  s = (MultiObjTestSolver<2> *)
      std::unique_ptr<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
      ::operator*((unique_ptr<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
                   *)in_stack_ffffffffffffff50);
  this_00 = (BasicStringRef<char> *)
            &((SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
               *)((long)in_RDI.data_ + 0x88))->num_options_;
  h = (Handler *)&stack0xffffffffffffffb8;
  std::function<void_()>::function((function<void_()> *)this_00);
  internal::
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  ::SolverNLHandlerImpl
            ((SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
              *)in_RDI.data_,(MultiObjMockProblemBuilder *)this_02,s,after_h);
  local_49 = 0;
  std::
  unique_ptr<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  ::reset((unique_ptr<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
           *)this_00,(pointer)in_stack_ffffffffffffff48);
  std::function<void_()>::~function((function<void_()> *)0x23224e);
  fmt::BasicStringRef<char>::BasicStringRef
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff48);
  std::
  unique_ptr<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  ::operator*((unique_ptr<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
               *)this_00);
  filename.size_ = (size_t)s;
  filename.data_ = (char *)after_h;
  MockNLReader<MultiObjTestSolver<2>_>::Read
            ((MockNLReader<MultiObjTestSolver<2>_> *)this_01,filename,h,
             (int)((ulong)this_00 >> 0x20));
  local_68 = GetTimeAndReset((time_point *)this_01);
  iVar1 = BasicSolver::timing((BasicSolver *)
                              &((SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
                                 *)((long)in_RDI.data_ + 0x88))->num_options_);
  if (iVar1 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"Input time = {:.6f}s\n");
    BasicSolver::Print<double>(this_02,in_RDI,(double *)s);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::ReadNL(int nl_reader_flags) {
  std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();

  builder_.reset(new ProblemBuilder(solver_));
  handler_.reset(new internal::SolverNLHandler<Solver>(*builder_, solver_));
  this->Read(nl_filename, *handler_, nl_reader_flags);

  double read_time = GetTimeAndReset(start);
  if (solver_.timing())
    solver_.Print("Input time = {:.6f}s\n", read_time);
}